

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexo.h
# Opt level: O3

void rx__int_assess_comparison
               (rx_context *context,rx__int x1,rx__int x2,rx__op op,char *expr1,char *expr2,
               char *file,int line,rx_severity severity,char *failure_fmt,...)

{
  rx_status rVar1;
  char *in_RAX;
  char *s;
  char *pcVar2;
  ulong uVar3;
  char *file_00;
  char *pcVar4;
  size_t rx__length;
  char *diagnostic_msg;
  
  if (context == (rx_context *)0x0) {
    __assert_fail("context != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x159c,
                  "void rx__int_assess_comparison(struct rx_context *, rx__int, rx__int, enum rx__op, const char *, const char *, const char *, int, enum rx_severity, const char *, ...)"
                 );
  }
  uVar3 = x2 & 0xffffffff;
  if (x1 == 0) {
    s = (char *)0x0;
    pcVar4 = (char *)0x1;
    rVar1 = rx_handle_test_result
                      ((rx_context *)context->summary,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
                       ,(int)x2,RX_NONFATAL,(char *)0x0,in_RAX);
    pcVar2 = (char *)0x0;
    goto LAB_00103e6e;
  }
  pcVar2 = (char *)0x0;
  rVar1 = rx__str_initialize((size_t *)&stack0xffffffffffffffc8,(char *)0x0,
                             "`%s` is expected to be %s `%s`","status","equal to","W_SUCCESS");
  pcVar4 = in_RAX;
  if (rVar1 == RX_SUCCESS) {
    s = (char *)malloc((size_t)in_RAX);
    if (s == (char *)0x0) {
      rx__log(RX_LOG_LEVEL_ALL,pcVar2,0x15ca,"failed to allocate the string (%lu bytes)\n",in_RAX);
      goto LAB_00103db7;
    }
    pcVar2 = s;
    rVar1 = rx__str_initialize((size_t *)&stack0xffffffffffffffc8,s,"`%s` is expected to be %s `%s`"
                               ,"status","equal to","W_SUCCESS");
    if (rVar1 != RX_SUCCESS) {
      free(s);
      goto LAB_00103db7;
    }
  }
  else {
LAB_00103db7:
    s = (char *)0x0;
    rx__log(RX_LOG_LEVEL_ALL,pcVar2,0x15d3,
            "failed to create the failure message for the integer comparison test located at %s:%d\n"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
            ,uVar3);
  }
  file_00 = (char *)0x0;
  rVar1 = rx__str_initialize((size_t *)&stack0xffffffffffffffc8,(char *)0x0,"%ld %s %ld",x1,"==",0);
  diagnostic_msg = pcVar4;
  if (rVar1 == RX_SUCCESS) {
    pcVar2 = (char *)malloc((size_t)pcVar4);
    if (pcVar2 == (char *)0x0) {
      rx__log(RX_LOG_LEVEL_ALL,file_00,0x15dd,"failed to allocate the string (%lu bytes)\n",pcVar4);
      goto LAB_00103e04;
    }
    file_00 = pcVar2;
    rVar1 = rx__str_initialize((size_t *)&stack0xffffffffffffffc8,pcVar2,"%ld %s %ld",x1,"==",0);
    if (rVar1 != RX_SUCCESS) {
      free(pcVar2);
      goto LAB_00103e04;
    }
  }
  else {
LAB_00103e04:
    pcVar2 = (char *)0x0;
    rx__log(RX_LOG_LEVEL_ALL,file_00,0x15e2,
            "failed to create the diagnostic message for the integer comparison test located at %s:%d\n"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
            ,uVar3);
  }
  pcVar4 = (char *)0x0;
  rVar1 = rx_handle_test_result
                    ((rx_context *)context->summary,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
                     ,(int)x2,(rx_severity)s,pcVar2,diagnostic_msg);
LAB_00103e6e:
  if (rVar1 != RX_SUCCESS) {
    rx__log(RX_LOG_LEVEL_ALL,pcVar4,0x15ed,
            "failed to handle the test result for the integer comparison test located at %s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/vmem.c"
            ,uVar3);
  }
  free(s);
  free(pcVar2);
  if (x1 == 0) {
    return;
  }
  longjmp((__jmp_buf_tag *)context,1);
}

Assistant:

static void
rx__int_assess_comparison(struct rx_context *context,
                          rx__int x1,
                          rx__int x2,
                          enum rx__op op,
                          const char *expr1,
                          const char *expr2,
                          const char *file,
                          int line,
                          enum rx_severity severity,
                          const char *failure_fmt,
                          ...)
{
    int result;
    char *failure_msg;
    char *diagnostic_msg;

    RX_ASSERT(context != NULL);
    RX_ASSERT(expr1 != NULL);
    RX_ASSERT(expr2 != NULL);
    RX_ASSERT(file != NULL);

    switch (op) {
        case RX__OP_EQUAL:
            result = x1 == x2;
            break;
        case RX__OP_NOT_EQUAL:
            result = x1 != x2;
            break;
        case RX__OP_GREATER:
            result = x1 > x2;
            break;
        case RX__OP_LESSER:
            result = x1 < x2;
            break;
        case RX__OP_GREATER_OR_EQUAL:
            result = x1 >= x2;
            break;
        case RX__OP_LESSER_OR_EQUAL:
            result = x1 <= x2;
            break;
        default:
            RX_ASSERT(0);
            result = 0;
            break;
    }

    if (result) {
        failure_msg = NULL;
        diagnostic_msg = NULL;
    } else {
        enum rx_status status;
        const char *op_symbol;

        if (failure_fmt == NULL) {
            const char *op_name;

            rx__op_get_name(&op_name, op);
            RX__STR_CREATE_3(status,
                             failure_msg,
                             "`%s` is expected to be %s `%s`",
                             expr1,
                             op_name,
                             expr2);
        } else {
            RX__STR_CREATE_VA_LIST(status, failure_msg, failure_fmt);
        }

        if (status != RX_SUCCESS) {
            RX__LOG_DEBUG_2("failed to create the failure message for "
                            "the integer comparison test located at %s:%d\n",
                            file,
                            line);
            failure_msg = NULL;
        }

        rx__op_get_symbol(&op_symbol, op);
        RX__STR_CREATE_3(status,
                         diagnostic_msg,
                         "%ld %s %ld",
                         (long)x1,
                         op_symbol,
                         (long)x2);
        if (status != RX_SUCCESS) {
            RX__LOG_DEBUG_2("failed to create the diagnostic message for "
                            "the integer comparison test located at %s:%d\n",
                            file,
                            line);
            diagnostic_msg = NULL;
        }
    }

    if (rx_handle_test_result(
            context, result, file, line, severity, failure_msg, diagnostic_msg)
        != RX_SUCCESS) {
        RX__LOG_DEBUG_2("failed to handle the test result for the integer "
                        "comparison test located at %s:%d\n",
                        file,
                        line);
    }

    RX_FREE(failure_msg);
    RX_FREE(diagnostic_msg);

    if (!result && severity == RX_FATAL) {
        rx_abort(context);
    }
}